

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTSIZEDec2(octet *der,size_t count,u32 tag,size_t val)

{
  size_t sVar1;
  size_t val_local;
  
  val_local = val;
  sVar1 = derTSIZEDec(&val_local,der,count,tag);
  if (val_local != val) {
    sVar1 = 0xffffffffffffffff;
  }
  return sVar1;
}

Assistant:

size_t derTSIZEDec2(const octet der[], size_t count, u32 tag, size_t val)
{
	register size_t v = val;
	count = derTSIZEDec(&val, der, count, tag);
	if (v != val)
		count = SIZE_MAX;
	v = 0;
	return count;
}